

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHParameters.cpp
# Opt level: O2

bool __thiscall DHParameters::deserialise(DHParameters *this,ByteString *serialised)

{
  size_t sVar1;
  unsigned_long uVar2;
  bool bVar3;
  ByteString dLen;
  ByteString dG;
  ByteString dP;
  ByteString BStack_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::chainDeserialise(&local_38,serialised);
  ByteString::chainDeserialise(&local_60,serialised);
  ByteString::chainDeserialise(&BStack_88,serialised);
  sVar1 = ByteString::size(&local_38);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_60);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&BStack_88);
      if (sVar1 != 0) {
        ByteString::operator=(&this->p,&local_38);
        ByteString::operator=(&this->g,&local_60);
        uVar2 = ByteString::long_val(&BStack_88);
        this->bitLen = uVar2;
        bVar3 = true;
        goto LAB_0012b55c;
      }
    }
  }
  bVar3 = false;
LAB_0012b55c:
  ByteString::~ByteString(&BStack_88);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return bVar3;
}

Assistant:

bool DHParameters::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dLen = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dLen.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setXBitLength(dLen.long_val());

	return true;
}